

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode multi_runsingle(Curl_multi *multi,timeval now,Curl_easy *data)

{
  connectdata **connp;
  int *piVar1;
  byte bVar2;
  Curl_do_more_func p_Var3;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var4;
  Curl_easy *pCVar5;
  curl_llist_element *pcVar6;
  timeval now_00;
  timeval now_01;
  timeval now_02;
  timeval now_03;
  timeval newer;
  timeval now_04;
  timeval newer_00;
  timeval newer_01;
  timeval newer_02;
  bool bVar7;
  _Bool _Var8;
  CURLMstate oldstate;
  CURLcode CVar9;
  CURLMstate CVar10;
  CURLcode CVar11;
  int iVar12;
  CURLMstate CVar13;
  int iVar14;
  time_t tVar15;
  long lVar16;
  Curl_dns_entry *pCVar17;
  long lVar18;
  CURLcode status;
  char *pcVar19;
  CURLMcode CVar20;
  connectdata *conn;
  connectdata *pcVar21;
  followtype type;
  bool bVar22;
  _Bool protocol_connect;
  _Bool dophase_done;
  _Bool done;
  _Bool comeback;
  char *newurl;
  _Bool async;
  _Bool connected;
  int control;
  _Bool local_6c;
  _Bool local_6b;
  _Bool local_6a;
  _Bool local_69;
  Curl_easy *local_68;
  _Bool local_5b;
  _Bool local_5a;
  _Bool local_59;
  CURLMcode local_58;
  int local_54;
  timeval local_50;
  Curl_easy *local_40;
  Curl_message *local_38;
  
  local_50.tv_usec = now.tv_usec;
  local_50.tv_sec = now.tv_sec;
  local_6c = false;
  local_6b = false;
  local_6a = false;
  CVar20 = CURLM_BAD_EASY_HANDLE;
  if ((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) {
    connp = &data->easy_conn;
    local_38 = &data->msg;
    status = CURLE_OK;
    do {
      if ((data->state).pipe_broke == true) {
        CVar20 = CURLM_OK;
        Curl_infof(data,"Pipe broke: handle %p, url = %s\n",data,(data->state).path);
        if (data->mstate < CURLM_STATE_COMPLETED) {
          CVar20 = CURLM_CALL_MULTI_PERFORM;
          status = CURLE_OK;
          if (data->mstate != CURLM_STATE_CONNECT) {
            data->mstate = CURLM_STATE_CONNECT;
            Curl_init_CONNECT(data);
            status = CURLE_OK;
          }
        }
        (data->state).pipe_broke = false;
        data->easy_conn = (connectdata *)0x0;
        iVar12 = 3;
        goto LAB_0012f4ec;
      }
      if ((*connp == (connectdata *)0x0) && (data->mstate - CURLM_STATE_WAITRESOLVE < 0xd)) {
        CVar20 = CURLM_OK;
        Curl_failf(data,"In state %d with no easy_conn, bail out!\n");
        local_58 = CURLM_INTERNAL_ERROR;
        iVar12 = 1;
        goto LAB_0012f4ec;
      }
      _Var8 = multi->recheckstate;
      multi->recheckstate = false;
      if (_Var8 == true) {
        Curl_multi_process_pending_handles(multi);
      }
      pcVar21 = *connp;
      if (pcVar21 != (connectdata *)0x0) {
        if (data->mstate - CURLM_STATE_WAITRESOLVE < 0xe) {
          pcVar21->data = data;
        }
        if (((pcVar21 == (connectdata *)0x0) || (0xe < data->mstate - CURLM_STATE_CONNECT)) ||
           (tVar15 = Curl_timeleft(data,&local_50,data->mstate < CURLM_STATE_DO), -1 < tVar15))
        goto LAB_0012e5a1;
        if (data->mstate == CURLM_STATE_WAITCONNECT) {
          newer_00.tv_usec = local_50.tv_usec;
          newer_00.tv_sec = local_50.tv_sec;
          tVar15 = curlx_tvdiff(newer_00,(data->progress).t_startsingle);
          pcVar19 = "Connection timed out after %ld milliseconds";
LAB_0012ea9f:
          Curl_failf(data,pcVar19,tVar15);
        }
        else {
          if (data->mstate == CURLM_STATE_WAITRESOLVE) {
            newer.tv_usec = local_50.tv_usec;
            newer.tv_sec = local_50.tv_sec;
            tVar15 = curlx_tvdiff(newer,(data->progress).t_startsingle);
            pcVar19 = "Resolving timed out after %ld milliseconds";
            goto LAB_0012ea9f;
          }
          newer_02.tv_usec = local_50.tv_usec;
          newer_02.tv_sec = local_50.tv_sec;
          newer_01.tv_usec = local_50.tv_usec;
          newer_01.tv_sec = local_50.tv_sec;
          if ((data->req).size == -1) {
            tVar15 = curlx_tvdiff(newer_02,(data->progress).t_startsingle);
            Curl_failf(data,"Operation timed out after %ld milliseconds with %lld bytes received",
                       tVar15,(data->req).bytecount);
          }
          else {
            tVar15 = curlx_tvdiff(newer_01,(data->progress).t_startsingle);
            Curl_failf(data,
                       "Operation timed out after %ld milliseconds with %lld out of %lld bytes received"
                       ,tVar15,(data->req).bytecount,(data->req).size);
          }
        }
        bVar22 = CURLM_STATE_DO < data->mstate;
        if (bVar22) {
          Curl_conncontrol(*connp,2);
        }
        status = CURLE_OPERATION_TIMEDOUT;
        _Var8 = true;
LAB_0012f0a6:
        CVar20 = CURLM_OK;
        multi_done(connp,status,_Var8);
        goto LAB_0012f3a2;
      }
LAB_0012e5a1:
      CVar20 = CURLM_OK;
      iVar12 = 1;
      switch(data->mstate) {
      case CURLM_STATE_INIT:
        status = Curl_pretransfer(data);
        if (status != CURLE_OK) goto LAB_0012efee;
        if (data->mstate != CURLM_STATE_CONNECT) {
          data->mstate = CURLM_STATE_CONNECT;
          Curl_init_CONNECT(data);
        }
        Curl_pgrsTime(data,TIMER_STARTOP);
        goto LAB_0012f286;
      case CURLM_STATE_CONNECT_PEND:
        goto switchD_0012e5c5_caseD_1;
      case CURLM_STATE_CONNECT:
        Curl_pgrsTime(data,TIMER_STARTSINGLE);
        status = Curl_connect(data,connp,&local_5b,&local_6c);
        CVar20 = CURLM_OK;
        if (status == CURLE_OK) {
          status = Curl_add_handle_to_pipeline(data,data->easy_conn);
          if (status == CURLE_OK) {
            if (local_5b != true) {
              if (local_6c == true) goto LAB_0012ef07;
              if (data->easy_conn->tunnel_state[0] == TUNNEL_CONNECT) {
                if (data->mstate != CURLM_STATE_WAITPROXYCONNECT) {
                  data->mstate = CURLM_STATE_WAITPROXYCONNECT;
                }
              }
              else if (data->mstate != CURLM_STATE_WAITCONNECT) {
                data->mstate = CURLM_STATE_WAITCONNECT;
              }
              goto LAB_0012f286;
            }
            bVar22 = false;
            status = CURLE_OK;
            CVar20 = CURLM_OK;
            if (data->mstate != CURLM_STATE_WAITRESOLVE) {
              data->mstate = CURLM_STATE_WAITRESOLVE;
              goto LAB_0012f520;
            }
            break;
          }
          goto LAB_0012ee83;
        }
        if (status == CURLE_NO_CONNECTION_AVAILABLE) {
          if (data->mstate != CURLM_STATE_CONNECT_PEND) {
            data->mstate = CURLM_STATE_CONNECT_PEND;
          }
          iVar12 = Curl_llist_insert_next(multi->pending,multi->pending->tail,data);
          bVar22 = false;
          status = CURLE_OK;
          if (iVar12 == 0) {
            status = CURLE_OUT_OF_MEMORY;
          }
          goto LAB_0012eff1;
        }
        goto switchD_0012e5c5_caseD_1;
      case CURLM_STATE_WAITRESOLVE:
        pcVar21 = *connp;
        lVar16 = 0x148;
        if (((pcVar21->bits).httpproxy == false) &&
           (lVar16 = 0xc0, (pcVar21->bits).conn_to_host != false)) {
          lVar16 = 0xe8;
        }
        pcVar19 = *(char **)((pcVar21->chunk).hexbuffer + lVar16 + -8);
        pCVar17 = Curl_fetch_addr(pcVar21,pcVar19,(int)pcVar21->port);
        if (pCVar17 == (Curl_dns_entry *)0x0) {
          status = CURLE_COULDNT_RESOLVE_HOST;
        }
        else {
          status = CURLE_OK;
          Curl_infof(data,"Hostname \'%s\' was found in DNS cache\n",pcVar19);
        }
        singlesocket(multi,data);
        if (pCVar17 == (Curl_dns_entry *)0x0) {
          CVar20 = CURLM_OK;
        }
        else if (local_6c == true) {
          if (multi == (Curl_multi *)0x0) {
            CVar10 = CURLM_STATE_DO;
          }
          else {
            CVar10 = (CURLMstate)multi->pipelining & CURLM_STATE_CONNECT_PEND ^ CURLM_STATE_DO;
          }
          CVar20 = CURLM_CALL_MULTI_PERFORM;
          status = CURLE_OK;
          if (data->mstate != CVar10) {
            data->mstate = CVar10;
            if (*(code **)(mstate_finit + (ulong)CVar10 * 8) != (code *)0x0) {
              (**(code **)(mstate_finit + (ulong)CVar10 * 8))(data);
            }
          }
        }
        else {
          CVar20 = CURLM_CALL_MULTI_PERFORM;
          if (data->easy_conn->tunnel_state[0] == TUNNEL_CONNECT) {
            status = CURLE_OK;
            if (data->mstate != CURLM_STATE_WAITPROXYCONNECT) {
              data->mstate = CURLM_STATE_WAITPROXYCONNECT;
            }
          }
          else {
            status = CURLE_OK;
            if (data->mstate != CURLM_STATE_WAITCONNECT) {
              data->mstate = CURLM_STATE_WAITCONNECT;
            }
          }
        }
LAB_0012f37e:
        bVar22 = status != CURLE_OK;
        break;
      case CURLM_STATE_WAITCONNECT:
        status = Curl_is_connected(*connp,0,&local_5a);
        if ((status == CURLE_OK & local_5a) != 1) goto LAB_0012f37e;
        pcVar21 = *connp;
        if ((((pcVar21->http_proxy).proxytype != CURLPROXY_HTTPS) ||
            ((pcVar21->bits).proxy_ssl_connected[0] == true)) &&
           (pcVar21->tunnel_state[0] != TUNNEL_CONNECT)) {
          bVar2 = (pcVar21->bits).tunnel_proxy;
          iVar12 = 6;
LAB_0012f176:
          CVar10 = iVar12 - (uint)bVar2;
LAB_0012f25b:
          if (data->mstate != CVar10) {
            data->mstate = CVar10;
            if (*(code **)(mstate_finit + (ulong)CVar10 * 8) != (code *)0x0) {
              (**(code **)(mstate_finit + (ulong)CVar10 * 8))(data);
            }
          }
          goto LAB_0012f286;
        }
        bVar22 = false;
        status = CURLE_OK;
        CVar20 = CURLM_OK;
        if (data->mstate != CURLM_STATE_WAITPROXYCONNECT) {
          data->mstate = CURLM_STATE_WAITPROXYCONNECT;
          goto LAB_0012f520;
        }
        break;
      case CURLM_STATE_WAITPROXYCONNECT:
        status = Curl_http_connect(*connp,&local_6c);
        pcVar21 = *connp;
        if ((pcVar21->bits).proxy_connect_closed == true) {
          multi_done(connp,CURLE_OK,false);
          if (data->mstate != CURLM_STATE_CONNECT) {
            data->mstate = CURLM_STATE_CONNECT;
            Curl_init_CONNECT(data);
          }
        }
        else {
          if (status != CURLE_OK) goto LAB_0012efee;
          if ((pcVar21->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar22 = false;
            status = CURLE_OK;
            CVar20 = CURLM_OK;
            if ((pcVar21->bits).proxy_ssl_connected[0] != true) break;
          }
          bVar22 = false;
          status = CURLE_OK;
          CVar20 = CURLM_OK;
          if (pcVar21->tunnel_state[0] == TUNNEL_CONNECT) break;
          if (data->mstate != CURLM_STATE_SENDPROTOCONNECT) {
            data->mstate = CURLM_STATE_SENDPROTOCONNECT;
          }
        }
        goto LAB_0012f286;
      case CURLM_STATE_SENDPROTOCONNECT:
        status = Curl_protocol_connect(*connp,&local_6c);
        if (local_6c != false) {
          if (status == CURLE_OK) {
LAB_0012ef07:
            if (multi == (Curl_multi *)0x0) {
              CVar10 = CURLM_STATE_DO;
            }
            else {
              CVar10 = (CURLMstate)multi->pipelining & CURLM_STATE_CONNECT_PEND ^ CURLM_STATE_DO;
            }
            goto LAB_0012f25b;
          }
LAB_0012e9f2:
          Curl_posttransfer(data);
          _Var8 = true;
          goto LAB_0012ee7e;
        }
        bVar22 = false;
        if (data->mstate == CURLM_STATE_PROTOCONNECT) goto LAB_0012eff1;
        data->mstate = CURLM_STATE_PROTOCONNECT;
        goto LAB_0012efee;
      case CURLM_STATE_PROTOCONNECT:
        status = Curl_protocol_connecting(*connp,&local_6c);
        if (status != CURLE_OK) goto LAB_0012e9f2;
        bVar22 = false;
        status = CURLE_OK;
        CVar20 = CURLM_OK;
        if (local_6c == true) goto LAB_0012ef07;
        break;
      case CURLM_STATE_WAITDO:
        _Var8 = Curl_pipeline_checkget_write(data,data->easy_conn);
        bVar22 = false;
        if (_Var8) {
          CVar20 = CURLM_CALL_MULTI_PERFORM;
          if (data->mstate != CURLM_STATE_DO) {
            data->mstate = CURLM_STATE_DO;
          }
          goto switchD_0012e5c5_caseD_1;
        }
        goto LAB_0012eff1;
      case CURLM_STATE_DO:
        pcVar21 = data->easy_conn;
        if ((data->set).connect_only != true) {
          p_Var4 = pcVar21->handler->do_it;
          if (p_Var4 == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
LAB_0012ec26:
            status = CURLE_OK;
          }
          else {
            pCVar5 = pcVar21->data;
            status = (*p_Var4)(pcVar21,&local_6b);
            if ((status == CURLE_SEND_ERROR) &&
               (status = CURLE_SEND_ERROR, (pcVar21->bits).reuse == true)) {
              if (pCVar5->multi == (Curl_multi *)0x0) {
                pCVar5 = (Curl_easy *)*connp;
                local_40 = pCVar5->next;
                local_68 = pCVar5;
                Curl_infof(local_40,"Re-used connection seems dead, get a new one\n");
                Curl_conncontrol((connectdata *)pCVar5,1);
                status = multi_done((connectdata **)&local_68,CURLE_OK,false);
                *connp = (connectdata *)0x0;
                if ((status == CURLE_SEND_ERROR) || (status == CURLE_OK)) {
                  local_59 = true;
                  status = Curl_connect(local_40,connp,&local_69,&local_59);
                  if (status == CURLE_OK) {
                    local_68 = (Curl_easy *)*connp;
                    status = CURLE_OK;
                    if (local_69 != false) {
                      status = CURLE_COULDNT_RESOLVE_HOST;
                    }
                  }
                }
                if (status == CURLE_OK) {
                  pcVar21 = *connp;
                  status = (*pcVar21->handler->do_it)(pcVar21,&local_6b);
                }
                goto LAB_0012ebe9;
              }
            }
            else {
LAB_0012ebe9:
              if (status == CURLE_OK) {
                if (local_6b == true) {
                  pCVar5 = pcVar21->data;
                  (pCVar5->req).chunk = false;
                  iVar12 = pcVar21->writesockfd;
                  if (pcVar21->writesockfd < pcVar21->sockfd) {
                    iVar12 = pcVar21->sockfd;
                  }
                  (pCVar5->req).maxfd = iVar12 + 1;
                  Curl_pgrsTime(pCVar5,TIMER_PRETRANSFER);
                }
                goto LAB_0012ec26;
              }
            }
          }
          if (status == CURLE_SEND_ERROR) {
            if (((*connp)->bits).reuse == true) {
              local_68 = (Curl_easy *)0x0;
              CVar9 = Curl_retry_request(*connp,(char **)&local_68);
              local_40 = local_68;
              status = CVar9;
              if (CVar9 == CURLE_OK) {
                status = CURLE_SEND_ERROR;
              }
              Curl_posttransfer(data);
              CVar11 = multi_done(connp,status,false);
              bVar22 = CVar9 != CURLE_OK;
              if ((bVar22) || (local_40 == (Curl_easy *)0x0)) {
                (*Curl_cfree)(local_68);
                goto LAB_0012ee83;
              }
              if (((CVar11 != CURLE_SEND_ERROR) && (status = CVar11, CVar11 != CURLE_OK)) ||
                 (status = Curl_follow(data,(char *)local_68,FOLLOW_RETRY), status != CURLE_OK)) {
                (*Curl_cfree)(local_68);
                goto LAB_0012eff1;
              }
              CVar20 = CURLM_CALL_MULTI_PERFORM;
              status = CURLE_OK;
              if (data->mstate != CURLM_STATE_CONNECT) {
                data->mstate = CURLM_STATE_CONNECT;
                Curl_init_CONNECT(data);
              }
              break;
            }
          }
          else if (status == CURLE_OK) {
            if (local_6b == false) {
              if ((data->set).wildcardmatch == true) {
                status = CURLE_OK;
                if (((data->wildcard).state | CURLWC_DOWNLOADING) == CURLWC_DONE) {
                  multi_done(connp,CURLE_OK,false);
                  CVar20 = CURLM_CALL_MULTI_PERFORM;
                  if (data->mstate != CURLM_STATE_DONE) {
                    data->mstate = CURLM_STATE_DONE;
                  }
                  bVar7 = false;
                }
                else {
                  bVar7 = true;
                  CVar20 = CURLM_OK;
                }
                bVar22 = false;
                if (!bVar7) break;
              }
              bVar22 = false;
              status = CURLE_OK;
              CVar20 = CURLM_OK;
              if (data->mstate != CURLM_STATE_DOING) {
                data->mstate = CURLM_STATE_DOING;
                goto LAB_0012f520;
              }
            }
            else {
              if ((data->easy_conn->bits).do_more != true) {
                if (data->mstate != CURLM_STATE_DO_DONE) {
                  data->mstate = CURLM_STATE_DO_DONE;
                }
                goto LAB_0012f286;
              }
              bVar22 = false;
              status = CURLE_OK;
              CVar20 = CURLM_OK;
              if (data->mstate != CURLM_STATE_DO_MORE) {
                data->mstate = CURLM_STATE_DO_MORE;
                goto LAB_0012f520;
              }
            }
            break;
          }
          Curl_posttransfer(data);
          bVar22 = true;
          if (data->easy_conn != (connectdata *)0x0) {
            _Var8 = false;
            goto LAB_0012f0a6;
          }
          goto LAB_0012eff1;
        }
        Curl_conncontrol(pcVar21,0);
        if (data->mstate != CURLM_STATE_DONE) {
          data->mstate = CURLM_STATE_DONE;
        }
LAB_0012f286:
        bVar22 = false;
        CVar20 = CURLM_CALL_MULTI_PERFORM;
        status = CURLE_OK;
        break;
      case CURLM_STATE_DOING:
        status = Curl_protocol_doing(*connp,&local_6b);
        if (status != CURLE_OK) goto LAB_0012ee6c;
        bVar22 = false;
        status = CURLE_OK;
        CVar20 = CURLM_OK;
        if (local_6b == true) {
          bVar2 = (data->easy_conn->bits).do_more;
          iVar12 = 0xc;
          goto LAB_0012f176;
        }
        break;
      case CURLM_STATE_DO_MORE:
        pcVar21 = *connp;
        local_54 = 0;
        p_Var3 = pcVar21->handler->do_more;
        if (p_Var3 == (Curl_do_more_func)0x0) {
          status = CURLE_OK;
        }
        else {
          status = (*p_Var3)(pcVar21,&local_54);
        }
        if ((status == CURLE_OK) && (local_54 == 1)) {
          pCVar5 = pcVar21->data;
          (pCVar5->req).chunk = false;
          iVar12 = pcVar21->writesockfd;
          if (pcVar21->writesockfd < pcVar21->sockfd) {
            iVar12 = pcVar21->sockfd;
          }
          (pCVar5->req).maxfd = iVar12 + 1;
          Curl_pgrsTime(pCVar5,TIMER_PRETRANSFER);
        }
        if (status == CURLE_OK) {
          if (local_54 != 0) {
            CVar10 = (uint)(local_54 == 1) * 2 + CURLM_STATE_DOING;
            goto LAB_0012f25b;
          }
          goto LAB_0012f520;
        }
LAB_0012ee6c:
        Curl_posttransfer(data);
        _Var8 = false;
LAB_0012ee7e:
        multi_done(connp,status,_Var8);
LAB_0012ee83:
        CVar20 = CURLM_OK;
        bVar22 = true;
        break;
      case CURLM_STATE_DO_DONE:
        Curl_move_handle_from_send_to_recv_pipe(data,data->easy_conn);
        Curl_multi_process_pending_handles(multi);
        if ((data->easy_conn->sockfd == -1) && (data->easy_conn->writesockfd == -1)) {
          CVar20 = CURLM_CALL_MULTI_PERFORM;
          if (data->mstate != CURLM_STATE_DONE) {
            data->mstate = CURLM_STATE_DONE;
          }
        }
        else {
          CVar20 = CURLM_CALL_MULTI_PERFORM;
          if (data->mstate != CURLM_STATE_WAITPERFORM) {
            data->mstate = CURLM_STATE_WAITPERFORM;
          }
        }
        goto switchD_0012e5c5_caseD_1;
      case CURLM_STATE_WAITPERFORM:
        _Var8 = Curl_pipeline_checkget_read(data,data->easy_conn);
        bVar22 = false;
        if (!_Var8) goto LAB_0012eff1;
        CVar20 = CURLM_CALL_MULTI_PERFORM;
        if (data->mstate != CURLM_STATE_PERFORM) {
          data->mstate = CURLM_STATE_PERFORM;
        }
switchD_0012e5c5_caseD_1:
        bVar22 = false;
        break;
      case CURLM_STATE_PERFORM:
        local_68 = (Curl_easy *)0x0;
        local_69 = false;
        lVar16 = (data->set).max_send_speed;
        if (lVar16 < 1) {
          lVar16 = 0;
        }
        else {
          now_00.tv_usec = local_50.tv_usec;
          now_00.tv_sec = local_50.tv_sec;
          lVar16 = Curl_pgrsLimitWaitTime
                             ((data->progress).uploaded,(data->progress).ul_limit_size,lVar16,
                              (data->progress).ul_limit_start,now_00);
        }
        lVar18 = (data->set).max_recv_speed;
        if (lVar18 < 1) {
          lVar18 = 0;
        }
        else {
          now_02.tv_usec = local_50.tv_usec;
          now_02.tv_sec = local_50.tv_sec;
          lVar18 = Curl_pgrsLimitWaitTime
                             ((data->progress).downloaded,(data->progress).dl_limit_size,lVar18,
                              (data->progress).dl_limit_start,now_02);
        }
        if ((0 < lVar16) || (0 < lVar18)) {
          if (data->mstate != CURLM_STATE_TOOFAST) {
            data->mstate = CURLM_STATE_TOOFAST;
          }
          if (lVar16 < lVar18) {
            lVar16 = lVar18;
          }
          Curl_expire_latest(data,lVar16);
          goto LAB_0012efee;
        }
        status = Curl_readwrite(data->easy_conn,data,&local_6a,&local_69);
        if (((data->req).keepon & 1) == 0) {
          Curl_pipeline_leave_read(*connp);
        }
        if (((data->req).keepon & 2) == 0) {
          Curl_pipeline_leave_write(*connp);
        }
        if ((status == CURLE_RECV_ERROR | local_6a) == 1) {
          CVar9 = Curl_retry_request(*connp,(char **)&local_68);
          bVar22 = local_68 != (Curl_easy *)0x0 && CVar9 == CURLE_OK;
          if (local_68 != (Curl_easy *)0x0 && CVar9 == CURLE_OK) {
            local_6a = true;
            bVar22 = true;
            status = CURLE_OK;
          }
        }
        else {
          bVar22 = false;
        }
        if (status == CURLE_OK) {
          if (local_6a == true) {
            Curl_posttransfer(data);
            Curl_removeHandleFromPipeline(data,data->easy_conn->recv_pipe);
            pcVar6 = data->easy_conn->recv_pipe->head;
            if (pcVar6 != (curl_llist_element *)0x0) {
              Curl_expire_latest((Curl_easy *)pcVar6->ptr,0);
            }
            Curl_multi_process_pending_handles(multi);
            if ((bool)(~bVar22 & (data->req).newurl == (char *)0x0)) {
              if ((data->req).location == (char *)0x0) {
LAB_0012f6c0:
                bVar22 = false;
                status = CURLE_OK;
              }
              else {
                (*Curl_cfree)(local_68);
                local_68 = (Curl_easy *)(data->req).location;
                (data->req).location = (char *)0x0;
                status = Curl_follow(data,(char *)local_68,FOLLOW_FAKE);
                if (status == CURLE_OK) {
                  local_68 = (Curl_easy *)0x0;
                  goto LAB_0012f6c0;
                }
                bVar22 = true;
              }
              CVar20 = CURLM_CALL_MULTI_PERFORM;
              if (data->mstate != CURLM_STATE_DONE) {
                data->mstate = CURLM_STATE_DONE;
              }
              goto LAB_0012f394;
            }
            type = FOLLOW_RETRY;
            if (!bVar22) {
              (*Curl_cfree)(local_68);
              local_68 = (Curl_easy *)(data->req).newurl;
              (data->req).newurl = (char *)0x0;
              type = FOLLOW_REDIR;
            }
            CVar20 = CURLM_OK;
            status = multi_done(connp,CURLE_OK,false);
            if (status != CURLE_OK) {
              bVar22 = false;
              goto LAB_0012f394;
            }
            status = Curl_follow(data,(char *)local_68,type);
            if (status != CURLE_OK) goto LAB_0012f03c;
            if (data->mstate != CURLM_STATE_CONNECT) {
              data->mstate = CURLM_STATE_CONNECT;
              Curl_init_CONNECT(data);
            }
            local_68 = (Curl_easy *)0x0;
            CVar20 = CURLM_CALL_MULTI_PERFORM;
          }
          else {
            CVar20 = -(uint)local_69;
          }
          bVar22 = false;
          status = CURLE_OK;
        }
        else {
          if ((status != CURLE_HTTP2_STREAM) && (((*connp)->handler->flags & 2) == 0)) {
            Curl_conncontrol(*connp,2);
          }
          Curl_posttransfer(data);
          multi_done(connp,status,true);
LAB_0012f03c:
          bVar22 = false;
          CVar20 = CURLM_OK;
        }
LAB_0012f394:
        (*Curl_cfree)(local_68);
        break;
      case CURLM_STATE_TOOFAST:
        iVar12 = Curl_pgrsUpdate(*connp);
        status = CURLE_ABORTED_BY_CALLBACK;
        if (iVar12 == 0) {
          now_04.tv_usec = local_50.tv_usec;
          now_04.tv_sec = local_50.tv_sec;
          status = Curl_speedcheck(data,now_04);
        }
        bVar22 = false;
        CVar20 = CURLM_OK;
        if (status == CURLE_OK) {
          lVar16 = (data->set).max_send_speed;
          if (lVar16 < 1) {
            lVar16 = 0;
          }
          else {
            now_01.tv_usec = local_50.tv_usec;
            now_01.tv_sec = local_50.tv_sec;
            lVar16 = Curl_pgrsLimitWaitTime
                               ((data->progress).uploaded,(data->progress).ul_limit_size,lVar16,
                                (data->progress).ul_limit_start,now_01);
          }
          lVar18 = (data->set).max_recv_speed;
          if (lVar18 < 1) {
            lVar18 = 0;
          }
          else {
            now_03.tv_usec = local_50.tv_usec;
            now_03.tv_sec = local_50.tv_sec;
            lVar18 = Curl_pgrsLimitWaitTime
                               ((data->progress).downloaded,(data->progress).dl_limit_size,lVar18,
                                (data->progress).dl_limit_start,now_03);
          }
          if ((lVar16 < 1) && (lVar18 < 1)) {
            bVar22 = false;
            status = CURLE_OK;
            CVar20 = CURLM_OK;
            if (data->mstate == CURLM_STATE_PERFORM) break;
            data->mstate = CURLM_STATE_PERFORM;
          }
          else {
            if (lVar16 < lVar18) {
              lVar16 = lVar18;
            }
            Curl_expire_latest(data,lVar16);
          }
LAB_0012f520:
          bVar22 = false;
          status = CURLE_OK;
          goto LAB_0012eff1;
        }
        break;
      case CURLM_STATE_DONE:
        if (*connp != (connectdata *)0x0) {
          Curl_removeHandleFromPipeline(data,(*connp)->recv_pipe);
          Curl_multi_process_pending_handles(multi);
          CVar9 = multi_done(connp,status,false);
          if (status != CURLE_OK) {
            CVar9 = status;
          }
          status = CVar9;
          if (data->easy_conn != (connectdata *)0x0) {
            *connp = (connectdata *)0x0;
          }
        }
        if (((data->set).wildcardmatch == true) && ((data->wildcard).state != CURLWC_DONE)) {
          if (data->mstate != CURLM_STATE_INIT) {
            data->mstate = CURLM_STATE_INIT;
          }
        }
        else if (data->mstate != CURLM_STATE_COMPLETED) {
          data->mstate = CURLM_STATE_COMPLETED;
          piVar1 = &data->multi->num_alive;
          *piVar1 = *piVar1 + -1;
        }
        CVar20 = CURLM_CALL_MULTI_PERFORM;
        bVar22 = false;
        break;
      case CURLM_STATE_COMPLETED:
        data->easy_conn = (connectdata *)0x0;
        Curl_expire_clear(data);
LAB_0012efee:
        bVar22 = false;
LAB_0012eff1:
        CVar20 = CURLM_OK;
        break;
      case CURLM_STATE_MSGSENT:
        data->result = status;
        CVar20 = CURLM_OK;
        local_58 = CURLM_OK;
        goto LAB_0012f4ec;
      default:
        local_58 = CURLM_INTERNAL_ERROR;
        goto LAB_0012f4ec;
      }
LAB_0012f3a2:
      if (data->mstate < CURLM_STATE_COMPLETED) {
        if (status == CURLE_OK) {
          status = CURLE_OK;
          if ((*connp != (connectdata *)0x0) && (iVar12 = Curl_pgrsUpdate(*connp), iVar12 != 0)) {
            Curl_conncontrol(data->easy_conn,2);
            CVar10 = data->mstate;
            CVar13 = CURLM_STATE_COMPLETED - (CVar10 < CURLM_STATE_DONE);
            CVar20 = CURLM_CALL_MULTI_PERFORM;
            status = CURLE_ABORTED_BY_CALLBACK;
            if (CVar10 != CVar13) {
              data->mstate = CVar13;
              if (CURLM_STATE_TOOFAST < CVar10) {
                piVar1 = &data->multi->num_alive;
                *piVar1 = *piVar1 + -1;
              }
              if (*(code **)(mstate_finit + (ulong)CVar13 * 8) != (code *)0x0) {
                (**(code **)(mstate_finit + (ulong)CVar13 * 8))(data);
              }
            }
          }
        }
        else {
          (data->state).pipe_broke = false;
          Curl_multi_process_pending_handles(multi);
          if (data->easy_conn == (connectdata *)0x0) {
            if (data->mstate == CURLM_STATE_CONNECT) {
              Curl_posttransfer(data);
            }
          }
          else {
            Curl_pipeline_leave_write(data->easy_conn);
            Curl_pipeline_leave_read(data->easy_conn);
            Curl_removeHandleFromPipeline(data,data->easy_conn->send_pipe);
            Curl_removeHandleFromPipeline(data,data->easy_conn->recv_pipe);
            if (bVar22) {
              Curl_disconnect(*connp,status == CURLE_OPERATION_TIMEDOUT);
              *connp = (connectdata *)0x0;
            }
          }
          if (data->mstate != CURLM_STATE_COMPLETED) {
            data->mstate = CURLM_STATE_COMPLETED;
            piVar1 = &data->multi->num_alive;
            *piVar1 = *piVar1 + -1;
          }
        }
      }
      iVar12 = 0;
      if (data->mstate == CURLM_STATE_COMPLETED) {
        (data->msg).extmsg.msg = CURLMSG_DONE;
        (data->msg).extmsg.easy_handle = data;
        (data->msg).extmsg.data.result = status;
        iVar14 = Curl_llist_insert_next(multi->msglist,multi->msglist->tail,local_38);
        CVar20 = (uint)(iVar14 == 0) * 3;
        if (data->mstate != CURLM_STATE_MSGSENT) {
          data->mstate = CURLM_STATE_MSGSENT;
        }
      }
LAB_0012f4ec:
      if ((iVar12 != 3) && (iVar12 != 0)) {
        return local_58;
      }
    } while ((CVar20 == CURLM_CALL_MULTI_PERFORM) || (multi->recheckstate != false));
    data->result = status;
  }
  return CVar20;
}

Assistant:

static CURLMcode multi_runsingle(struct Curl_multi *multi,
                                 struct timeval now,
                                 struct Curl_easy *data)
{
  struct Curl_message *msg = NULL;
  bool connected;
  bool async;
  bool protocol_connect = FALSE;
  bool dophase_done = FALSE;
  bool done = FALSE;
  CURLMcode rc;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k;
  time_t timeout_ms;
  time_t recv_timeout_ms;
  time_t send_timeout_ms;
  int control;

  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  do {
    /* A "stream" here is a logical stream if the protocol can handle that
       (HTTP/2), or the full connection for older protocols */
    bool stream_error = FALSE;
    rc = CURLM_OK;

    /* Handle the case when the pipe breaks, i.e., the connection
       we're using gets cleaned up and we're left with nothing. */
    if(data->state.pipe_broke) {
      infof(data, "Pipe broke: handle %p, url = %s\n",
            (void *)data, data->state.path);

      if(data->mstate < CURLM_STATE_COMPLETED) {
        /* Head back to the CONNECT state */
        multistate(data, CURLM_STATE_CONNECT);
        rc = CURLM_CALL_MULTI_PERFORM;
        result = CURLE_OK;
      }

      data->state.pipe_broke = FALSE;
      data->easy_conn = NULL;
      continue;
    }

    if(!data->easy_conn &&
       data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_DONE) {
      /* In all these states, the code will blindly access 'data->easy_conn'
         so this is precaution that it isn't NULL. And it silences static
         analyzers. */
      failf(data, "In state %d with no easy_conn, bail out!\n", data->mstate);
      return CURLM_INTERNAL_ERROR;
    }

    if(multi_ischanged(multi, TRUE)) {
      DEBUGF(infof(data, "multi changed, check CONNECT_PEND queue!\n"));
      Curl_multi_process_pending_handles(multi);
    }

    if(data->easy_conn && data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_COMPLETED)
      /* Make sure we set the connection's current owner */
      data->easy_conn->data = data;

    if(data->easy_conn &&
       (data->mstate >= CURLM_STATE_CONNECT) &&
       (data->mstate < CURLM_STATE_COMPLETED)) {
      /* we need to wait for the connect state as only then is the start time
         stored, but we must not check already completed handles */

      timeout_ms = Curl_timeleft(data, &now,
                                 (data->mstate <= CURLM_STATE_WAITDO)?
                                 TRUE:FALSE);

      if(timeout_ms < 0) {
        /* Handle timed out */
        if(data->mstate == CURLM_STATE_WAITRESOLVE)
          failf(data, "Resolving timed out after %ld milliseconds",
                Curl_tvdiff(now, data->progress.t_startsingle));
        else if(data->mstate == CURLM_STATE_WAITCONNECT)
          failf(data, "Connection timed out after %ld milliseconds",
                Curl_tvdiff(now, data->progress.t_startsingle));
        else {
          k = &data->req;
          if(k->size != -1) {
            failf(data, "Operation timed out after %ld milliseconds with %"
                  CURL_FORMAT_CURL_OFF_T " out of %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_tvdiff(now, data->progress.t_startsingle),
                  k->bytecount, k->size);
          }
          else {
            failf(data, "Operation timed out after %ld milliseconds with %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_tvdiff(now, data->progress.t_startsingle),
                  k->bytecount);
          }
        }

        /* Force connection closed if the connection has indeed been used */
        if(data->mstate > CURLM_STATE_DO) {
          streamclose(data->easy_conn, "Disconnected with pending data");
          stream_error = TRUE;
        }
        result = CURLE_OPERATION_TIMEDOUT;
        (void)multi_done(&data->easy_conn, result, TRUE);
        /* Skip the statemachine and go directly to error handling section. */
        goto statemachine_end;
      }
    }

    switch(data->mstate) {
    case CURLM_STATE_INIT:
      /* init this transfer. */
      result=Curl_pretransfer(data);

      if(!result) {
        /* after init, go CONNECT */
        multistate(data, CURLM_STATE_CONNECT);
        Curl_pgrsTime(data, TIMER_STARTOP);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_CONNECT_PEND:
      /* We will stay here until there is a connection available. Then
         we try again in the CURLM_STATE_CONNECT state. */
      break;

    case CURLM_STATE_CONNECT:
      /* Connect. We want to get a connection identifier filled in. */
      Curl_pgrsTime(data, TIMER_STARTSINGLE);
      result = Curl_connect(data, &data->easy_conn,
                            &async, &protocol_connect);
      if(CURLE_NO_CONNECTION_AVAILABLE == result) {
        /* There was no connection available. We will go to the pending
           state and wait for an available connection. */
        multistate(data, CURLM_STATE_CONNECT_PEND);

        /* add this handle to the list of connect-pending handles */
        if(!Curl_llist_insert_next(multi->pending, multi->pending->tail, data))
          result = CURLE_OUT_OF_MEMORY;
        else
          result = CURLE_OK;
        break;
      }

      if(!result) {
        /* Add this handle to the send or pend pipeline */
        result = Curl_add_handle_to_pipeline(data, data->easy_conn);
        if(result)
          stream_error = TRUE;
        else {
          if(async)
            /* We're now waiting for an asynchronous name lookup */
            multistate(data, CURLM_STATE_WAITRESOLVE);
          else {
            /* after the connect has been sent off, go WAITCONNECT unless the
               protocol connect is already done and we can go directly to
               WAITDO or DO! */
            rc = CURLM_CALL_MULTI_PERFORM;

            if(protocol_connect)
              multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                         CURLM_STATE_WAITDO:CURLM_STATE_DO);
            else {
#ifndef CURL_DISABLE_HTTP
              if(data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
                multistate(data, CURLM_STATE_WAITPROXYCONNECT);
              else
#endif
                multistate(data, CURLM_STATE_WAITCONNECT);
            }
          }
        }
      }
      break;

    case CURLM_STATE_WAITRESOLVE:
      /* awaiting an asynch name resolve to complete */
    {
      struct Curl_dns_entry *dns = NULL;
      struct connectdata *conn = data->easy_conn;
      const char *hostname;

      if(conn->bits.httpproxy)
        hostname = conn->http_proxy.host.name;
      else if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
      else
        hostname = conn->host.name;

      /* check if we have the name resolved by now */
      dns = Curl_fetch_addr(conn, hostname, (int)conn->port);

      if(dns) {
#ifdef CURLRES_ASYNCH
        conn->async.dns = dns;
        conn->async.done = TRUE;
#endif
        result = CURLE_OK;
        infof(data, "Hostname '%s' was found in DNS cache\n", hostname);
      }

      if(!dns)
        result = Curl_resolver_is_resolved(data->easy_conn, &dns);

      /* Update sockets here, because the socket(s) may have been
         closed and the application thus needs to be told, even if it
         is likely that the same socket(s) will again be used further
         down.  If the name has not yet been resolved, it is likely
         that new sockets have been opened in an attempt to contact
         another resolver. */
      singlesocket(multi, data);

      if(dns) {
        /* Perform the next step in the connection phase, and then move on
           to the WAITCONNECT state */
        result = Curl_async_resolved(data->easy_conn, &protocol_connect);

        if(result)
          /* if Curl_async_resolved() returns failure, the connection struct
             is already freed and gone */
          data->easy_conn = NULL;           /* no more connection */
        else {
          /* call again please so that we get the next socket setup */
          rc = CURLM_CALL_MULTI_PERFORM;
          if(protocol_connect)
            multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                       CURLM_STATE_WAITDO:CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }

      if(result) {
        /* failure detected */
        stream_error = TRUE;
        break;
      }
    }
    break;

#ifndef CURL_DISABLE_HTTP
    case CURLM_STATE_WAITPROXYCONNECT:
      /* this is HTTP-specific, but sending CONNECT to a proxy is HTTP... */
      result = Curl_http_connect(data->easy_conn, &protocol_connect);

      if(data->easy_conn->bits.proxy_connect_closed) {
        rc = CURLM_CALL_MULTI_PERFORM;
        /* connect back to proxy again */
        result = CURLE_OK;
        multi_done(&data->easy_conn, CURLE_OK, FALSE);
        multistate(data, CURLM_STATE_CONNECT);
      }
      else if(!result) {
        if((data->easy_conn->http_proxy.proxytype != CURLPROXY_HTTPS ||
           data->easy_conn->bits.proxy_ssl_connected[FIRSTSOCKET]) &&
           (data->easy_conn->tunnel_state[FIRSTSOCKET] != TUNNEL_CONNECT)) {
          rc = CURLM_CALL_MULTI_PERFORM;
          /* initiate protocol connect phase */
          multistate(data, CURLM_STATE_SENDPROTOCONNECT);
        }
      }
      break;
#endif

    case CURLM_STATE_WAITCONNECT:
      /* awaiting a completion of an asynch TCP connect */
      result = Curl_is_connected(data->easy_conn, FIRSTSOCKET, &connected);
      if(connected && !result) {
#ifndef CURL_DISABLE_HTTP
        if((data->easy_conn->http_proxy.proxytype == CURLPROXY_HTTPS &&
            !data->easy_conn->bits.proxy_ssl_connected[FIRSTSOCKET]) ||
            (data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)) {
          multistate(data, CURLM_STATE_WAITPROXYCONNECT);
          break;
        }
#endif
        rc = CURLM_CALL_MULTI_PERFORM;
        multistate(data, data->easy_conn->bits.tunnel_proxy?
                   CURLM_STATE_WAITPROXYCONNECT:
                   CURLM_STATE_SENDPROTOCONNECT);
      }
      else if(result) {
        /* failure detected */
        /* Just break, the cleaning up is handled all in one place */
        stream_error = TRUE;
        break;
      }
      break;

    case CURLM_STATE_SENDPROTOCONNECT:
      result = Curl_protocol_connect(data->easy_conn, &protocol_connect);
      if(!protocol_connect)
        /* switch to waiting state */
        multistate(data, CURLM_STATE_PROTOCONNECT);
      else if(!result) {
        /* protocol connect has completed, go WAITDO or DO */
        multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                   CURLM_STATE_WAITDO:CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_PROTOCONNECT:
      /* protocol-specific connect phase */
      result = Curl_protocol_connecting(data->easy_conn, &protocol_connect);
      if(!result && protocol_connect) {
        /* after the connect has completed, go WAITDO or DO */
        multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                   CURLM_STATE_WAITDO:CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_WAITDO:
      /* Wait for our turn to DO when we're pipelining requests */
      if(Curl_pipeline_checkget_write(data, data->easy_conn)) {
        /* Grabbed the channel */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_DO:
      if(data->set.connect_only) {
        /* keep connection open for application to use the socket */
        connkeep(data->easy_conn, "CONNECT_ONLY");
        multistate(data, CURLM_STATE_DONE);
        result = CURLE_OK;
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else {
        /* Perform the protocol's DO action */
        result = multi_do(&data->easy_conn, &dophase_done);

        /* When multi_do() returns failure, data->easy_conn might be NULL! */

        if(!result) {
          if(!dophase_done) {
            /* some steps needed for wildcard matching */
            if(data->set.wildcardmatch) {
              struct WildcardData *wc = &data->wildcard;
              if(wc->state == CURLWC_DONE || wc->state == CURLWC_SKIP) {
                /* skip some states if it is important */
                multi_done(&data->easy_conn, CURLE_OK, FALSE);
                multistate(data, CURLM_STATE_DONE);
                rc = CURLM_CALL_MULTI_PERFORM;
                break;
              }
            }
            /* DO was not completed in one function call, we must continue
               DOING... */
            multistate(data, CURLM_STATE_DOING);
            rc = CURLM_OK;
          }

          /* after DO, go DO_DONE... or DO_MORE */
          else if(data->easy_conn->bits.do_more) {
            /* we're supposed to do more, but we need to sit down, relax
               and wait a little while first */
            multistate(data, CURLM_STATE_DO_MORE);
            rc = CURLM_OK;
          }
          else {
            /* we're done with the DO, now DO_DONE */
            multistate(data, CURLM_STATE_DO_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
        else if((CURLE_SEND_ERROR == result) &&
                data->easy_conn->bits.reuse) {
          /*
           * In this situation, a connection that we were trying to use
           * may have unexpectedly died.  If possible, send the connection
           * back to the CONNECT phase so we can try again.
           */
          char *newurl = NULL;
          followtype follow=FOLLOW_NONE;
          CURLcode drc;
          bool retry = FALSE;

          drc = Curl_retry_request(data->easy_conn, &newurl);
          if(drc) {
            /* a failure here pretty much implies an out of memory */
            result = drc;
            stream_error = TRUE;
          }
          else
            retry = (newurl)?TRUE:FALSE;

          Curl_posttransfer(data);
          drc = multi_done(&data->easy_conn, result, FALSE);

          /* When set to retry the connection, we must to go back to
           * the CONNECT state */
          if(retry) {
            if(!drc || (drc == CURLE_SEND_ERROR)) {
              follow = FOLLOW_RETRY;
              drc = Curl_follow(data, newurl, follow);
              if(!drc) {
                multistate(data, CURLM_STATE_CONNECT);
                rc = CURLM_CALL_MULTI_PERFORM;
                result = CURLE_OK;
              }
              else {
                /* Follow failed */
                result = drc;
                free(newurl);
              }
            }
            else {
              /* done didn't return OK or SEND_ERROR */
              result = drc;
              free(newurl);
            }
          }
          else {
            /* Have error handler disconnect conn if we can't retry */
            stream_error = TRUE;
            free(newurl);
          }
        }
        else {
          /* failure detected */
          Curl_posttransfer(data);
          if(data->easy_conn)
            multi_done(&data->easy_conn, result, FALSE);
          stream_error = TRUE;
        }
      }
      break;

    case CURLM_STATE_DOING:
      /* we continue DOING until the DO phase is complete */
      result = Curl_protocol_doing(data->easy_conn,
                                   &dophase_done);
      if(!result) {
        if(dophase_done) {
          /* after DO, go DO_DONE or DO_MORE */
          multistate(data, data->easy_conn->bits.do_more?
                     CURLM_STATE_DO_MORE:
                     CURLM_STATE_DO_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        } /* dophase_done */
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_MORE:
      /*
       * When we are connected, DO MORE and then go DO_DONE
       */
      result = multi_do_more(data->easy_conn, &control);

      /* No need to remove this handle from the send pipeline here since that
         is done in multi_done() */
      if(!result) {
        if(control) {
          /* if positive, advance to DO_DONE
             if negative, go back to DOING */
          multistate(data, control==1?
                     CURLM_STATE_DO_DONE:
                     CURLM_STATE_DOING);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
        else
          /* stay in DO_MORE */
          rc = CURLM_OK;
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_DONE:
      /* Move ourselves from the send to recv pipeline */
      Curl_move_handle_from_send_to_recv_pipe(data, data->easy_conn);
      /* Check if we can move pending requests to send pipe */
      Curl_multi_process_pending_handles(multi);

      /* Only perform the transfer if there's a good socket to work with.
         Having both BAD is a signal to skip immediately to DONE */
      if((data->easy_conn->sockfd != CURL_SOCKET_BAD) ||
         (data->easy_conn->writesockfd != CURL_SOCKET_BAD))
        multistate(data, CURLM_STATE_WAITPERFORM);
      else
        multistate(data, CURLM_STATE_DONE);
      rc = CURLM_CALL_MULTI_PERFORM;
      break;

    case CURLM_STATE_WAITPERFORM:
      /* Wait for our turn to PERFORM */
      if(Curl_pipeline_checkget_read(data, data->easy_conn)) {
        /* Grabbed the channel */
        multistate(data, CURLM_STATE_PERFORM);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_TOOFAST: /* limit-rate exceeded in either direction */
      /* if both rates are within spec, resume transfer */
      if(Curl_pgrsUpdate(data->easy_conn))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, now);

      if(!result) {
        send_timeout_ms = 0;
        if(data->set.max_send_speed > 0)
          send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                data->progress.ul_limit_size,
                                data->set.max_send_speed,
                                data->progress.ul_limit_start,
                                now);

        recv_timeout_ms = 0;
        if(data->set.max_recv_speed > 0)
          recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                data->progress.dl_limit_size,
                                data->set.max_recv_speed,
                                data->progress.dl_limit_start,
                                now);

        if(send_timeout_ms <= 0 && recv_timeout_ms <= 0)
          multistate(data, CURLM_STATE_PERFORM);
        else if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire_latest(data, send_timeout_ms);
        else
          Curl_expire_latest(data, recv_timeout_ms);
      }
      break;

    case CURLM_STATE_PERFORM:
    {
      char *newurl = NULL;
      bool retry = FALSE;
      bool comeback = FALSE;

      /* check if over send speed */
      send_timeout_ms = 0;
      if(data->set.max_send_speed > 0)
        send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                                 data->progress.ul_limit_size,
                                                 data->set.max_send_speed,
                                                 data->progress.ul_limit_start,
                                                 now);

      /* check if over recv speed */
      recv_timeout_ms = 0;
      if(data->set.max_recv_speed > 0)
        recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                                 data->progress.dl_limit_size,
                                                 data->set.max_recv_speed,
                                                 data->progress.dl_limit_start,
                                                 now);

      if(send_timeout_ms > 0 || recv_timeout_ms > 0) {
        multistate(data, CURLM_STATE_TOOFAST);
        if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire_latest(data, send_timeout_ms);
        else
          Curl_expire_latest(data, recv_timeout_ms);
        break;
      }

      /* read/write data if it is ready to do so */
      result = Curl_readwrite(data->easy_conn, data, &done, &comeback);

      k = &data->req;

      if(!(k->keepon & KEEP_RECV))
        /* We're done receiving */
        Curl_pipeline_leave_read(data->easy_conn);

      if(!(k->keepon & KEEP_SEND))
        /* We're done sending */
        Curl_pipeline_leave_write(data->easy_conn);

      if(done || (result == CURLE_RECV_ERROR)) {
        /* If CURLE_RECV_ERROR happens early enough, we assume it was a race
         * condition and the server closed the re-used connection exactly when
         * we wanted to use it, so figure out if that is indeed the case.
         */
        CURLcode ret = Curl_retry_request(data->easy_conn, &newurl);
        if(!ret)
          retry = (newurl)?TRUE:FALSE;

        if(retry) {
          /* if we are to retry, set the result to OK and consider the
             request as done */
          result = CURLE_OK;
          done = TRUE;
        }
      }

      if(result) {
        /*
         * The transfer phase returned error, we mark the connection to get
         * closed to prevent being re-used. This is because we can't possibly
         * know if the connection is in a good shape or not now.  Unless it is
         * a protocol which uses two "channels" like FTP, as then the error
         * happened in the data connection.
         */

        if(!(data->easy_conn->handler->flags & PROTOPT_DUAL) &&
           result != CURLE_HTTP2_STREAM)
          streamclose(data->easy_conn, "Transfer returned error");

        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
      }
      else if(done) {
        followtype follow=FOLLOW_NONE;

        /* call this even if the readwrite function returned error */
        Curl_posttransfer(data);

        /* we're no longer receiving */
        Curl_removeHandleFromPipeline(data, data->easy_conn->recv_pipe);

        /* expire the new receiving pipeline head */
        if(data->easy_conn->recv_pipe->head)
          Curl_expire_latest(data->easy_conn->recv_pipe->head->ptr, 0);

        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        /* When we follow redirects or is set to retry the connection, we must
           to go back to the CONNECT state */
        if(data->req.newurl || retry) {
          if(!retry) {
            /* if the URL is a follow-location and not just a retried request
               then figure out the URL here */
            free(newurl);
            newurl = data->req.newurl;
            data->req.newurl = NULL;
            follow = FOLLOW_REDIR;
          }
          else
            follow = FOLLOW_RETRY;
          result = multi_done(&data->easy_conn, CURLE_OK, FALSE);
          if(!result) {
            result = Curl_follow(data, newurl, follow);
            if(!result) {
              multistate(data, CURLM_STATE_CONNECT);
              rc = CURLM_CALL_MULTI_PERFORM;
              newurl = NULL; /* handed over the memory ownership to
                                Curl_follow(), make sure we don't free() it
                                here */
            }
          }
        }
        else {
          /* after the transfer is done, go DONE */

          /* but first check to see if we got a location info even though we're
             not following redirects */
          if(data->req.location) {
            free(newurl);
            newurl = data->req.location;
            data->req.location = NULL;
            result = Curl_follow(data, newurl, FOLLOW_FAKE);
            if(!result)
              newurl = NULL; /* allocation was handed over Curl_follow() */
            else
              stream_error = TRUE;
          }

          multistate(data, CURLM_STATE_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
      }
      else if(comeback)
        rc = CURLM_CALL_MULTI_PERFORM;

      free(newurl);
      break;
    }

    case CURLM_STATE_DONE:
      /* this state is highly transient, so run another loop after this */
      rc = CURLM_CALL_MULTI_PERFORM;

      if(data->easy_conn) {
        CURLcode res;

        /* Remove ourselves from the receive pipeline, if we are there. */
        Curl_removeHandleFromPipeline(data, data->easy_conn->recv_pipe);
        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        /* post-transfer command */
        res = multi_done(&data->easy_conn, result, FALSE);

        /* allow a previously set error code take precedence */
        if(!result)
          result = res;

        /*
         * If there are other handles on the pipeline, multi_done won't set
         * easy_conn to NULL.  In such a case, curl_multi_remove_handle() can
         * access free'd data, if the connection is free'd and the handle
         * removed before we perform the processing in CURLM_STATE_COMPLETED
         */
        if(data->easy_conn)
          data->easy_conn = NULL;
      }

      if(data->set.wildcardmatch) {
        if(data->wildcard.state != CURLWC_DONE) {
          /* if a wildcard is set and we are not ending -> lets start again
             with CURLM_STATE_INIT */
          multistate(data, CURLM_STATE_INIT);
          break;
        }
      }

      /* after we have DONE what we're supposed to do, go COMPLETED, and
         it doesn't matter what the multi_done() returned! */
      multistate(data, CURLM_STATE_COMPLETED);
      break;

    case CURLM_STATE_COMPLETED:
      /* this is a completed transfer, it is likely to still be connected */

      /* This node should be delinked from the list now and we should post
         an information message that we are complete. */

      /* Important: reset the conn pointer so that we don't point to memory
         that could be freed anytime */
      data->easy_conn = NULL;

      Curl_expire_clear(data); /* stop all timers */
      break;

    case CURLM_STATE_MSGSENT:
      data->result = result;
      return CURLM_OK; /* do nothing */

    default:
      return CURLM_INTERNAL_ERROR;
    }
    statemachine_end:

    if(data->mstate < CURLM_STATE_COMPLETED) {
      if(result) {
        /*
         * If an error was returned, and we aren't in completed state now,
         * then we go to completed and consider this transfer aborted.
         */

        /* NOTE: no attempt to disconnect connections must be made
           in the case blocks above - cleanup happens only here */

        data->state.pipe_broke = FALSE;

        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        if(data->easy_conn) {
          /* if this has a connection, unsubscribe from the pipelines */
          Curl_pipeline_leave_write(data->easy_conn);
          Curl_pipeline_leave_read(data->easy_conn);
          Curl_removeHandleFromPipeline(data, data->easy_conn->send_pipe);
          Curl_removeHandleFromPipeline(data, data->easy_conn->recv_pipe);

          if(stream_error) {
            /* Don't attempt to send data over a connection that timed out */
            bool dead_connection = result == CURLE_OPERATION_TIMEDOUT;
            /* disconnect properly */
            Curl_disconnect(data->easy_conn, dead_connection);

            /* This is where we make sure that the easy_conn pointer is reset.
               We don't have to do this in every case block above where a
               failure is detected */
            data->easy_conn = NULL;
          }
        }
        else if(data->mstate == CURLM_STATE_CONNECT) {
          /* Curl_connect() failed */
          (void)Curl_posttransfer(data);
        }

        multistate(data, CURLM_STATE_COMPLETED);
      }
      /* if there's still a connection to use, call the progress function */
      else if(data->easy_conn && Curl_pgrsUpdate(data->easy_conn)) {
        /* aborted due to progress callback return code must close the
           connection */
        result = CURLE_ABORTED_BY_CALLBACK;
        streamclose(data->easy_conn, "Aborted by callback");

        /* if not yet in DONE state, go there, otherwise COMPLETED */
        multistate(data, (data->mstate < CURLM_STATE_DONE)?
                   CURLM_STATE_DONE: CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
    }

    if(CURLM_STATE_COMPLETED == data->mstate) {
      /* now fill in the Curl_message with this info */
      msg = &data->msg;

      msg->extmsg.msg = CURLMSG_DONE;
      msg->extmsg.easy_handle = data;
      msg->extmsg.data.result = result;

      rc = multi_addmsg(multi, msg);

      multistate(data, CURLM_STATE_MSGSENT);
    }
  } while((rc == CURLM_CALL_MULTI_PERFORM) || multi_ischanged(multi, FALSE));

  data->result = result;


  return rc;
}